

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raspicam_still_test.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  ostream *poVar3;
  ulong uVar4;
  void *pvVar5;
  float fVar6;
  float fVar7;
  string local_290;
  string local_270;
  string local_250;
  ofstream file;
  
  usage();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_250,"-w",(allocator<char> *)&file);
  fVar6 = getParamVal(&local_250,argc,argv,2592.0);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,"-h",(allocator<char> *)&file);
  fVar7 = getParamVal(&local_270,argc,argv,1944.0);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_290,"-iso",(allocator<char> *)&file);
  getParamVal(&local_290,argc,argv,400.0);
  std::__cxx11::string::~string((string *)&local_290);
  poVar3 = std::operator<<((ostream *)&std::cout,"Initializing ...");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)fVar6);
  poVar3 = std::operator<<(poVar3,"x");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)fVar7);
  std::endl<char,std::char_traits<char>>(poVar3);
  raspicam::RaspiCam_Still::setWidth(0x105108);
  raspicam::RaspiCam_Still::setHeight(0x105108);
  raspicam::RaspiCam_Still::setISO(0x105108);
  raspicam::RaspiCam_Still::setEncoding(0x105108);
  raspicam::RaspiCam_Still::open();
  poVar3 = std::operator<<((ostream *)&std::cout,"capture");
  std::endl<char,std::char_traits<char>>(poVar3);
  uVar4 = raspicam::RaspiCam_Still::getImageBufferSize();
  pvVar5 = operator_new__(uVar4 & 0xffffffff);
  cVar1 = raspicam::RaspiCam_Still::grab_retrieve((uchar *)&Camera,(uint)pvVar5);
  if (cVar1 == '\0') {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Error in grab");
    std::endl<char,std::char_traits<char>>(poVar3);
    iVar2 = -1;
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"saving picture.bmp");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::ofstream::ofstream(&file,"picture.bmp",_S_bin);
    std::ostream::write((char *)&file,(long)pvVar5);
    std::ofstream::~ofstream(&file);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int main ( int argc, char *argv[] ) {
    usage();

    int width = getParamVal ( "-w",argc,argv,2592 );
    int height =getParamVal ( "-h",argc,argv,1944 );
    int iso=getParamVal ( "-iso",argc,argv,400);


    cout << "Initializing ..."<<width<<"x"<<height<<endl;
    Camera.setWidth ( width );
    Camera.setHeight ( height );
    Camera.setISO(iso);
    Camera.setEncoding ( raspicam::RASPICAM_ENCODING_BMP );
    Camera.open();
    cout<<"capture"<<endl;
    unsigned int length = Camera.getImageBufferSize(); // Header + Image Data + Padding
    unsigned char * data = new unsigned char[length];
      if ( !Camera.grab_retrieve(data, length) ) {
        cerr<<"Error in grab"<<endl;
        return -1;
    }

    cout<<"saving picture.bmp"<<endl;
    ofstream file ( "picture.bmp",ios::binary );
    file.write ( ( char* ) data,   length );
    return 0;
}